

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

void data_update_adadelta(data_t *data,double rate)

{
  float fVar1;
  double dVar2;
  int local_2c;
  int j;
  double EPSILON;
  double BETA;
  double rate_local;
  data_t *data_local;
  
  for (local_2c = 0; local_2c < data->size; local_2c = local_2c + 1) {
    data->m[local_2c] = data->m[local_2c] * 0.5 + data->grad[local_2c] * 0.5 * data->grad[local_2c];
    fVar1 = data->grad[local_2c];
    dVar2 = sqrt((double)data->m[local_2c] + 1e-06);
    data->val[local_2c] = (float)((double)data->val[local_2c] - (rate * (double)fVar1) / dVar2);
    data->grad[local_2c] = 0.0;
  }
  return;
}

Assistant:

void data_update_adadelta(data_t *data, double rate)
{
    const double BETA = 0.5;
    const double EPSILON = 1e-6;

    int j = 0;

    for (j = 0; j < data->size; ++j)
    {
        data->m[j] = BETA * data->m[j] + (1 - BETA) * data->grad[j] * data->grad[j];
        data->val[j] -= rate * data->grad[j] / sqrt(data->m[j] + EPSILON);
        data->grad[j] = 0;
    }
}